

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

float __thiscall nv::FloatImage::sampleNearest(FloatImage *this,float x,float y,int c,WrapMode wm)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  
  if (wm == WrapMode_Repeat) {
    fVar7 = floorf(x);
    uVar1 = this->m_width;
    fVar6 = floorf(y);
    fVar7 = this->m_mem
            [(c * (uint)this->m_height + (int)((float)this->m_height * (y - fVar6))) * (uint)uVar1 +
             (int)((float)uVar1 * (x - fVar7))];
  }
  else {
    if (wm != WrapMode_Clamp) {
      fVar7 = sampleNearestMirror(this,x,y,c);
      return fVar7;
    }
    uVar1 = this->m_width;
    uVar3 = (uint)((float)uVar1 * x);
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    if (uVar1 <= uVar3) {
      uVar3 = uVar1 - 1;
    }
    uVar2 = this->m_height;
    uVar5 = (uint)((float)uVar2 * y);
    uVar4 = 0;
    if (0 < (int)uVar5) {
      uVar4 = uVar5;
    }
    if (uVar2 <= uVar4) {
      uVar4 = uVar2 - 1;
    }
    fVar7 = this->m_mem[(c * (uint)uVar2 + uVar4) * (uint)uVar1 + uVar3];
  }
  return fVar7;
}

Assistant:

float FloatImage::sampleNearest(const float x, const float y, const int c, const WrapMode wm) const
{
	if( wm == WrapMode_Clamp ) return sampleNearestClamp(x, y, c);
	else if( wm == WrapMode_Repeat ) return sampleNearestRepeat(x, y, c);
	else /*if( wm == WrapMode_Mirror )*/ return sampleNearestMirror(x, y, c);
}